

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

UriBool uriOnExitOwnHost2W(UriParserStateW *state,wchar_t *first,UriMemoryManager *memory)

{
  wchar_t wVar1;
  UriIp4 *pUVar2;
  UriMemoryManager *memory_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  (state->uri->hostText).afterLast = first;
  pUVar2 = (UriIp4 *)(*memory->malloc)(memory,4);
  (state->uri->hostData).ip4 = pUVar2;
  if ((state->uri->hostData).ip4 == (UriIp4 *)0x0) {
    state_local._4_4_ = 0;
  }
  else {
    wVar1 = uriParseIpFourAddressW
                      (((state->uri->hostData).ip4)->data,(state->uri->hostText).first,
                       (state->uri->hostText).afterLast);
    if (wVar1 != L'\0') {
      (*memory->free)(memory,(state->uri->hostData).ip4);
      (state->uri->hostData).ip4 = (UriIp4 *)0x0;
    }
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

static URI_INLINE UriBool URI_FUNC(OnExitOwnHost2)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		UriMemoryManager * memory) {
	state->uri->hostText.afterLast = first; /* HOST END */

	/* Valid IPv4 or just a regname? */
	state->uri->hostData.ip4 = memory->malloc(memory, 1 * sizeof(UriIp4)); /* Freed when stopping on parse error */
	if (state->uri->hostData.ip4 == NULL) {
		return URI_FALSE; /* Raises malloc error */
	}
	if (URI_FUNC(ParseIpFourAddress)(state->uri->hostData.ip4->data,
			state->uri->hostText.first, state->uri->hostText.afterLast)) {
		/* Not IPv4 */
		memory->free(memory, state->uri->hostData.ip4);
		state->uri->hostData.ip4 = NULL;
	}
	return URI_TRUE; /* Success */
}